

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshba.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  fd_set *in_RCX;
  fd_set *__writefds;
  Hosts *__readfds;
  int __nfds;
  timeval *in_R8;
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  string local_110 [32];
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [8];
  string command;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [48];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  configDir_abi_cxx11_();
  std::operator+(local_38,(char *)local_58);
  readConfig(local_38,&config);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  configDir_abi_cxx11_();
  std::operator+(local_88,(char *)local_a8);
  __readfds = &hosts;
  readHosts(local_88,&hosts);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  if ((int)argv_local == 2) {
    pcVar1 = local_18[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,pcVar1,&local_c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,"key");
    if (bVar2) {
      changeConfig();
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"config");
      if (bVar2) {
        configDir_abi_cxx11_();
        poVar3 = std::operator<<((ostream *)&std::cout,local_f0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_f0);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"hosts");
        if (bVar2) {
          hostsPath_abi_cxx11_();
          editFile(local_110);
          std::__cxx11::string::~string((string *)local_110);
        }
      }
    }
    argv_local._4_4_ = 0;
    std::__cxx11::string::~string(local_c8);
  }
  else {
    __nfds = 0x10f240;
    bVar2 = std::vector<Host,_std::allocator<Host>_>::empty(&hosts);
    if (bVar2) {
      configDir_abi_cxx11_();
      std::operator+(local_130,(char *)local_150);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_130);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string(local_150);
      argv_local._4_4_ = 0;
    }
    else {
      display();
      select(__nfds,(fd_set *)__readfds,__writefds,in_RCX,in_R8);
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    readConfig(configDir() + "/config", config);
    readHosts(configDir() + "/hosts", hosts);
    if (argc == 2) {
        std::string command = argv[1];
        if (command == "key") {
            changeConfig();
        } else if (command == "config") {
            std::cout << configDir() << std::endl;
        } else if (command == "hosts") {
            editFile(hostsPath());
        }
        return 0;
    }
    if (hosts.empty()) {
        std::cout << configDir() + "/hosts is empty" << std::endl;
        return 0;
    }
    display();
    select();
    return 0;
}